

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O1

ssize_t __thiscall
higan::HttpServer::SendFileInternal
          (HttpServer *this,TcpConnectionPtr *connection,FileContextPtr *file_ptr)

{
  LogLevel LVar1;
  ssize_t sVar2;
  size_t index;
  long lVar3;
  Logger local_278;
  undefined1 local_60 [8];
  Buffer send_buffer;
  
  send_buffer.write_idx_ = (size_t)connection;
  Buffer::Buffer((Buffer *)local_60);
  lVar3 = 0;
  do {
    sVar2 = FileContext::ReadFileToBuffer
                      ((file_ptr->super___shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr,(Buffer *)local_60);
    if (sVar2 == 0) {
      lVar3 = 0;
      break;
    }
    if (sVar2 < 0) {
      LVar1 = Logger::GetLogLevel();
      lVar3 = -1;
      if ((int)LVar1 < 4) {
        Logger::Logger(&local_278,ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/http/HttpServer.cpp"
                       ,0x73,"SendFileInternal");
        Logger::operator<<(&local_278,"read file error");
LAB_0011b3d9:
        lVar3 = -1;
        Logger::~Logger(&local_278);
      }
      break;
    }
    index = TcpConnection::Send(*(TcpConnection **)send_buffer.write_idx_,(Buffer *)local_60);
    Buffer::AddReadIndex((Buffer *)local_60,index);
    if (index == 0xffffffffffffffff) {
      LVar1 = Logger::GetLogLevel();
      lVar3 = -1;
      if ((int)LVar1 < 4) {
        Logger::Logger(&local_278,ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/http/HttpServer.cpp"
                       ,0x7e,"SendFileInternal");
        Logger::operator<<(&local_278,"send file error");
        goto LAB_0011b3d9;
      }
      break;
    }
    lVar3 = lVar3 + index;
  } while (sVar2 <= (long)index);
  Buffer::~Buffer((Buffer *)local_60);
  return lVar3;
}

Assistant:

ssize_t HttpServer::SendFileInternal(const TcpConnectionPtr& connection, const FileContext::FileContextPtr& file_ptr)
{
	ssize_t read_size = -1;
	ssize_t send_size = -1;
	ssize_t sum_send_size = 0;
	Buffer send_buffer;

	ssize_t result = -1;

	while (true)
	{
		read_size = file_ptr->ReadFileToBuffer(&send_buffer);
		if (read_size == 0)
		{
			result = 0;
			break;
		}
		else if (read_size < 0)
		{
			LOG_ERROR << "read file error";
			result = -1;
			break;
		}

		send_size = connection->Send(&send_buffer);
		send_buffer.AddReadIndex(send_size);
		sum_send_size += send_size;

		if (send_size == -1)
		{
			LOG_ERROR << "send file error";
			result = -1;
			break;
		}
		else if (send_size < read_size)
		{
			result =  sum_send_size;
			break;
		}
	}
	return result;
}